

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

uint gl4cts::Utils::getNumberOfComponentsForVariableType(_variable_type type)

{
  TestError *this;
  uint local_10;
  uint result;
  _variable_type type_local;
  
  switch(type) {
  case VARIABLE_TYPE_BOOL:
  case VARIABLE_TYPE_DOUBLE:
  case VARIABLE_TYPE_FLOAT:
  case VARIABLE_TYPE_INT:
  case VARIABLE_TYPE_UINT:
    local_10 = 1;
    break;
  default:
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Unrecognized type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
               ,0x378);
    __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  case VARIABLE_TYPE_DMAT2:
  case VARIABLE_TYPE_MAT2:
    local_10 = 4;
    break;
  case VARIABLE_TYPE_DMAT2X3:
  case VARIABLE_TYPE_DMAT3X2:
  case VARIABLE_TYPE_MAT2X3:
  case VARIABLE_TYPE_MAT3X2:
    local_10 = 6;
    break;
  case VARIABLE_TYPE_DMAT2X4:
  case VARIABLE_TYPE_DMAT4X2:
  case VARIABLE_TYPE_MAT2X4:
  case VARIABLE_TYPE_MAT4X2:
    local_10 = 8;
    break;
  case VARIABLE_TYPE_DMAT3:
  case VARIABLE_TYPE_MAT3:
    local_10 = 9;
    break;
  case VARIABLE_TYPE_DMAT3X4:
  case VARIABLE_TYPE_DMAT4X3:
  case VARIABLE_TYPE_MAT3X4:
  case VARIABLE_TYPE_MAT4X3:
    local_10 = 0xc;
    break;
  case VARIABLE_TYPE_DMAT4:
  case VARIABLE_TYPE_MAT4:
    local_10 = 0x10;
    break;
  case VARIABLE_TYPE_DVEC2:
  case VARIABLE_TYPE_IVEC2:
  case VARIABLE_TYPE_UVEC2:
  case VARIABLE_TYPE_VEC2:
    local_10 = 2;
    break;
  case VARIABLE_TYPE_DVEC3:
  case VARIABLE_TYPE_IVEC3:
  case VARIABLE_TYPE_UVEC3:
  case VARIABLE_TYPE_VEC3:
    local_10 = 3;
    break;
  case VARIABLE_TYPE_DVEC4:
  case VARIABLE_TYPE_IVEC4:
  case VARIABLE_TYPE_UVEC4:
  case VARIABLE_TYPE_VEC4:
    local_10 = 4;
  }
  return local_10;
}

Assistant:

unsigned int Utils::getNumberOfComponentsForVariableType(_variable_type type)
{
	unsigned int result = 0;

	switch (type)
	{
	case VARIABLE_TYPE_BOOL:
	case VARIABLE_TYPE_DOUBLE:
	case VARIABLE_TYPE_FLOAT:
	case VARIABLE_TYPE_INT:
	case VARIABLE_TYPE_UINT:
	{
		result = 1;

		break;
	}

	case VARIABLE_TYPE_DVEC2:
	case VARIABLE_TYPE_IVEC2:
	case VARIABLE_TYPE_UVEC2:
	case VARIABLE_TYPE_VEC2:
	{
		result = 2;

		break;
	}

	case VARIABLE_TYPE_DVEC3:
	case VARIABLE_TYPE_IVEC3:
	case VARIABLE_TYPE_UVEC3:
	case VARIABLE_TYPE_VEC3:
	{
		result = 3;

		break;
	}

	case VARIABLE_TYPE_DVEC4:
	case VARIABLE_TYPE_IVEC4:
	case VARIABLE_TYPE_UVEC4:
	case VARIABLE_TYPE_VEC4:
	{
		result = 4;

		break;
	}

	case VARIABLE_TYPE_DMAT2:
	case VARIABLE_TYPE_MAT2:
	{
		result = 2 * 2;

		break;
	}

	case VARIABLE_TYPE_DMAT2X3:
	case VARIABLE_TYPE_DMAT3X2:
	case VARIABLE_TYPE_MAT2X3:
	case VARIABLE_TYPE_MAT3X2:
	{
		result = 2 * 3;

		break;
	}

	case VARIABLE_TYPE_DMAT2X4:
	case VARIABLE_TYPE_DMAT4X2:
	case VARIABLE_TYPE_MAT2X4:
	case VARIABLE_TYPE_MAT4X2:
	{
		result = 2 * 4;

		break;
	}

	case VARIABLE_TYPE_DMAT3:
	case VARIABLE_TYPE_MAT3:
	{
		result = 3 * 3;

		break;
	}

	case VARIABLE_TYPE_DMAT3X4:
	case VARIABLE_TYPE_DMAT4X3:
	case VARIABLE_TYPE_MAT3X4:
	case VARIABLE_TYPE_MAT4X3:
	{
		result = 3 * 4;

		break;
	}

	case VARIABLE_TYPE_DMAT4:
	case VARIABLE_TYPE_MAT4:
	{
		result = 4 * 4;

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized type");
	}
	} /* switch (type) */

	return result;
}